

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

exr_result_t
exr_attr_string_init_static_with_length(exr_context_t ctxt,exr_attr_string_t *s,char *v,int32_t len)

{
  int in_ECX;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  _internal_exr_context *pctxt;
  exr_attr_string_t nil;
  undefined8 local_38;
  undefined8 local_30;
  int local_24;
  long local_20;
  int *local_18;
  long local_10;
  exr_result_t local_4;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_38,0,0x10);
  if (local_10 == 0) {
    local_4 = 2;
  }
  else if (local_24 < 0) {
    local_4 = (**(code **)(local_10 + 0x48))
                        (local_10,3,"Received request to allocate negative sized string (%d)",
                         local_24);
  }
  else if (local_20 == 0) {
    local_4 = (**(code **)(local_10 + 0x40))
                        (local_10,3,"Invalid static string argument to initialize");
  }
  else if (local_18 == (int *)0x0) {
    local_4 = (**(code **)(local_10 + 0x40))
                        (local_10,3,"Invalid reference to string object to initialize");
  }
  else {
    *(undefined8 *)local_18 = local_38;
    *(undefined8 *)(local_18 + 2) = local_30;
    *local_18 = local_24;
    *(long *)(local_18 + 2) = local_20;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_string_init_static_with_length (
    exr_context_t ctxt, exr_attr_string_t* s, const char* v, int32_t len)
{
    exr_attr_string_t nil = {0};
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (len < 0)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to allocate negative sized string (%d)",
            len);

    if (!v)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid static string argument to initialize");

    if (!s)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to string object to initialize");

    *s        = nil;
    s->length = len;
    s->str    = v;
    return EXR_ERR_SUCCESS;
}